

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

idx_t duckdb::TemplatedUpdateNumericStatistics<duckdb::uhugeint_t>
                (UpdateSegment *segment,SegmentStatistics *stats,UnifiedVectorFormat *update,
                idx_t count,SelectionVector *sel)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  bool bVar3;
  ulong uVar4;
  idx_t i_1;
  idx_t iVar5;
  ulong uVar6;
  idx_t row_idx;
  idx_t i;
  idx_t iVar7;
  uhugeint_t new_value;
  uhugeint_t new_value_00;
  
  pdVar1 = update->data;
  if ((update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    for (uVar6 = 0; count != uVar6; uVar6 = uVar6 + 1) {
      psVar2 = update->sel->sel_vector;
      uVar4 = uVar6;
      if (psVar2 != (sel_t *)0x0) {
        uVar4 = (ulong)psVar2[uVar6];
      }
      new_value_00.upper = *(uint64_t *)(pdVar1 + uVar4 * 0x10 + 8);
      new_value_00.lower = *(uint64_t *)(pdVar1 + uVar4 * 0x10);
      NumericStats::Update<duckdb::uhugeint_t>
                (&(stats->statistics).stats_union.numeric_data,new_value_00);
    }
    ::std::__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> *)
               &sel->selection_data);
    sel->sel_vector = (sel_t *)0x0;
    iVar5 = count;
  }
  else {
    SelectionVector::Initialize(sel,0x800);
    iVar5 = 0;
    for (iVar7 = 0; count != iVar7; iVar7 = iVar7 + 1) {
      psVar2 = update->sel->sel_vector;
      row_idx = iVar7;
      if (psVar2 != (sel_t *)0x0) {
        row_idx = (idx_t)psVar2[iVar7];
      }
      bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(update->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (bVar3) {
        sel->sel_vector[iVar5] = (sel_t)iVar7;
        iVar5 = iVar5 + 1;
        new_value.upper = *(uint64_t *)(pdVar1 + row_idx * 0x10 + 8);
        new_value.lower = *(uint64_t *)(pdVar1 + row_idx * 0x10);
        NumericStats::Update<duckdb::uhugeint_t>
                  (&(stats->statistics).stats_union.numeric_data,new_value);
      }
    }
  }
  return iVar5;
}

Assistant:

idx_t TemplatedUpdateNumericStatistics(UpdateSegment *segment, SegmentStatistics &stats, UnifiedVectorFormat &update,
                                       idx_t count, SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto &mask = update.validity;

	if (mask.AllValid()) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			stats.statistics.UpdateNumericStats<T>(update_data[idx]);
		}
		sel.Initialize(nullptr);
		return count;
	} else {
		idx_t not_null_count = 0;
		sel.Initialize(STANDARD_VECTOR_SIZE);
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			if (mask.RowIsValid(idx)) {
				sel.set_index(not_null_count++, i);
				stats.statistics.UpdateNumericStats<T>(update_data[idx]);
			}
		}
		return not_null_count;
	}
}